

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal.c
# Opt level: O3

void Opal_Port(Opal *self,uint16_t reg_num,uint8_t val)

{
  undefined4 uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ushort uVar5;
  byte bVar6;
  long lVar7;
  undefined6 in_register_00000032;
  OpalChannel *pOVar8;
  ulong uVar9;
  OpalOperator *self_00;
  bool bVar10;
  OpalChannel *chans [2];
  long local_48 [3];
  
  uVar4 = (uint)CONCAT62(in_register_00000032,reg_num);
  if (uVar4 == 0xbd) {
    self->TremoloDepth = (uint)(val >> 7);
    self->VibratoDepth = (uint)(val >> 6 & 1);
    return;
  }
  uVar3 = uVar4 & 0xe0;
  if ((reg_num & 0xe0) == 0) {
    if (reg_num == 8) {
      self->NoteSel = (uint)(val >> 6 & 1);
      lVar7 = 0x10;
      do {
        OpalChannel_ComputeKeyScaleNumber((OpalChannel *)((long)self->LastOutput + lVar7 + -8));
        lVar7 = lVar7 + 0x50;
      } while (lVar7 != 0x5b0);
      return;
    }
    if (reg_num != 0x104) {
      return;
    }
    bVar6 = 1;
    uVar4 = 0;
    do {
      uVar3 = uVar4 + 6;
      if (uVar4 < 3) {
        uVar3 = uVar4;
      }
      bVar10 = (bVar6 & val) == 0;
      pOVar8 = (OpalChannel *)0x0;
      if (!bVar10) {
        pOVar8 = self->Chan + (uVar3 + 3);
      }
      self->Chan[uVar3].ChannelPair = pOVar8;
      self->Chan[uVar3 + 3].Enable = (uint)bVar10;
      bVar6 = bVar6 * '\x02';
      uVar4 = uVar4 + 1;
    } while (uVar4 != 6);
    return;
  }
  if ((ushort)((short)uVar3 - 0xa0U) < 0x21) {
    uVar3 = uVar4 & 0xf;
    if (8 < uVar3) {
      return;
    }
    uVar2 = uVar3 + 9;
    if ((uVar4 >> 8 & 1) == 0) {
      uVar2 = uVar3;
    }
    local_48[0] = (long)self->Chan[0].Op + (ulong)(uVar2 * 0x50);
    local_48[1] = *(long *)((long)self->Chan[0].Op + (ulong)(uVar2 * 0x50) + 0x38);
    uVar3 = 2 - (local_48[1] == 0);
    if (((byte)reg_num & 0xf0) == 0xa0) {
      uVar9 = 0;
      do {
        lVar7 = local_48[uVar9];
        uVar4 = *(ushort *)(lVar7 + 0x28) & 0x300 | (uint)val;
        *(short *)(lVar7 + 0x28) = (short)uVar4;
        *(uint *)(lVar7 + 0x2c) = uVar4 << (*(byte *)(lVar7 + 0x2a) & 0x1f);
        uVar9 = uVar9 + 1;
      } while (uVar3 != uVar9);
      return;
    }
    if ((uVar4 & 0xf0) == 0xc0) {
      *(uint *)((long)self->Chan[0].Op + (ulong)(uVar2 * 0x50) + 0x48) = val >> 5 & 1;
      *(uint *)((long)self->Chan[0].Op + (ulong)(uVar2 * 0x50) + 0x44) = val >> 4 & 1;
      uVar5 = (ushort)(byte)(9 - (val >> 1 & 7));
      if ((val >> 1 & 7) == 0) {
        uVar5 = 0;
      }
      *(ushort *)((long)self->Chan[0].Op + (ulong)(uVar2 * 0x50) + 0x32) = uVar5;
      *(ushort *)((long)self->Chan[0].Op + (ulong)(uVar2 * 0x50) + 0x34) = (ushort)(val & 1);
      return;
    }
    if ((uVar4 & 0xf0) != 0xb0) {
      return;
    }
    bVar6 = val >> 2 & 7;
    uVar9 = 0;
    do {
      pOVar8 = (OpalChannel *)local_48[uVar9];
      uVar4 = (uint)(val >> 5 & 1);
      OpalOperator_SetKeyOn(pOVar8->Op[0],uVar4);
      OpalOperator_SetKeyOn(pOVar8->Op[1],uVar4);
      pOVar8->Octave = (ushort)bVar6;
      pOVar8->PhaseStep = (uint)pOVar8->Freq << bVar6;
      OpalChannel_ComputeKeyScaleNumber(pOVar8);
      uVar4 = (uint)(byte)pOVar8->Freq | (val & 3) << 8;
      pOVar8->Freq = (uint16_t)uVar4;
      pOVar8->PhaseStep = uVar4 << ((byte)pOVar8->Octave & 0x1f);
      OpalChannel_ComputeKeyScaleNumber(pOVar8);
      uVar9 = uVar9 + 1;
    } while (uVar3 != uVar9);
    return;
  }
  if (0x80 < uVar3 && uVar3 != 0xe0) {
    return;
  }
  if ((0xffc0c0c0U >> (uVar4 & 0x1f) & 1) != 0) {
    return;
  }
  uVar2 = op_lookup[uVar4 & 0x1f] + 0x12;
  if ((uVar4 >> 8 & 1) == 0) {
    uVar2 = op_lookup[uVar4 & 0x1f];
  }
  uVar4 = uVar3 - 0x20 >> 5;
  if (6 < uVar4) {
    return;
  }
  self_00 = self->Op + uVar2;
  switch(uVar4) {
  case 0:
    self->Op[uVar2].TremoloEnable = (uint)(val >> 7);
    self->Op[uVar2].VibratoEnable = val >> 6 & 1;
    self->Op[uVar2].SustainMode = val >> 5 & 1;
    self->Op[uVar2].KeyScaleRate = val >> 4 & 1;
    OpalOperator_ComputeRates(self_00);
    self->Op[uVar2].FreqMultTimes2 = mul_times_2[val & 0xf];
    break;
  case 1:
    uVar1 = *(undefined4 *)(&DAT_001ad2d0 + (ulong)(val >> 6) * 4);
    self->Op[uVar2].KeyScaleShift = (uint16_t)uVar1;
    pOVar8 = self->Op[uVar2].Chan;
    self->Op[uVar2].KeyScaleLevel =
         levtab[(pOVar8->Octave & 0xfff) << 4 | (uint)(pOVar8->Freq >> 6)] >> ((byte)uVar1 & 0x1f);
    self->Op[uVar2].OutputLevel = (ushort)(byte)(val << 2);
    break;
  case 2:
    self->Op[uVar2].AttackRate = (ushort)(val >> 4);
    OpalOperator_ComputeRates(self_00);
    self->Op[uVar2].DecayRate = (ushort)(val & 0xf);
    goto LAB_00145392;
  case 3:
    uVar5 = 0x1f0;
    if (val < 0xf0) {
      uVar5 = (ushort)(val & 0xf0);
    }
    self->Op[uVar2].SustainLevel = uVar5;
    self->Op[uVar2].ReleaseRate = (ushort)(val & 0xf);
LAB_00145392:
    OpalOperator_ComputeRates(self_00);
    return;
  case 6:
    self->Op[uVar2].Waveform = (ushort)(val & 7);
  }
  return;
}

Assistant:

void Opal_Port(Opal *self, uint16_t reg_num, uint8_t val)
{
    int i;
    unsigned ui;
    uint8_t mask;
    unsigned numchans;
    uint16_t chan;
    int chan_num;
    int op_num;
    OpalChannel *primary, *secondary, *cchan;
    OpalChannel* chans[2];
    uint16_t type = reg_num & 0xE0;
    OpalOperator *op;

    /* Is it BD, the one-off register stuck in the middle of the register array? */
    if(reg_num == 0xBD)
    {
        self->TremoloDepth = (val & 0x80) != 0;
        self->VibratoDepth = (val & 0x40) != 0;
        return;
    }

    /* Global registers */
    if(type == 0x00)
    {

        /* 4-OP enables*/
        if(reg_num == 0x104)
        {

            /* Enable/disable channels based on which 4-op enables */
            mask = 1;

            for(i = 0; i < 6; i++, mask <<= 1)
            {
                /* The 4-op channels are 0, 1, 2, 9, 10, 11 */
                chan = i < 3 ? i : i + 6;
                primary = &self->Chan[chan];
                secondary = &self->Chan[chan + 3];

                if(val & mask)
                {
                    /* Let primary channel know it's controlling the secondary channel */
                    OpalChannel_SetChannelPair(primary, secondary);

                    /* Turn off the second channel in the pair */
                    OpalChannel_SetEnable(secondary, OPAL_FALSE);

                }
                else
                {
                    /* Let primary channel know it's no longer controlling the secondary channel */
                    OpalChannel_SetChannelPair(primary, 0);

                    /* Turn on the second channel in the pair */
                    OpalChannel_SetEnable(secondary, OPAL_TRUE);
                }
            }

            /* CSW / Note-sel */
        }
        else if(reg_num == 0x08)
        {
            self->NoteSel = (val & 0x40) != 0;

            /* Get the channels to recompute the Key Scale No. as this varies based on NoteSel */
            for(i = 0; i < OpalNumChannels; i++)
                OpalChannel_ComputeKeyScaleNumber(&self->Chan[i]);
        }

        /* Channel registers */
    }
    else if(type >= 0xA0 && type <= 0xC0)
    {
        /* Convert to channel number */
        chan_num = reg_num & 15;

        /* Valid channel? */
        if(chan_num >= 9)
            return;

        /* Is it the other bank of channels? */
        if(reg_num & 0x100)
            chan_num += 9;

        cchan = &self->Chan[chan_num];

        /* libADLMIDI: registers Ax and Cx affect both channels */
        chans[0] = cchan;
        chans[1] = OpalChannel_GetChannelPair(cchan);
        numchans = chans[1] ? 2 : 1;

        /* Do specific registers */
        switch(reg_num & 0xF0)
        {

        /* Frequency low */
        case 0xA0:
        {
            for(ui = 0; ui < numchans; ++ui)    /* libADLMIDI */
            {
                OpalChannel_SetFrequencyLow(chans[ui], val);
            }

            break;
        }

        /* Key-on / Octave / Frequency High */
        case 0xB0:
        {
            for(ui = 0; ui < numchans; ++ui)    /* libADLMIDI */
            {
                OpalChannel_SetKeyOn(chans[ui],(val & 0x20) != 0);
                OpalChannel_SetOctave(chans[ui], val >> 2 & 7);
                OpalChannel_SetFrequencyHigh(chans[ui], val & 3);
            }

            break;
        }

        /* Right Stereo Channel Enable / Left Stereo Channel Enable / Feedback Factor / Modulation Type */
        case 0xC0:
        {
            OpalChannel_SetRightEnable(cchan, (val & 0x20) != 0);
            OpalChannel_SetLeftEnable(cchan, (val & 0x10) != 0);
            OpalChannel_SetFeedback(cchan, val >> 1 & 7);
            OpalChannel_SetModulationType(cchan, val & 1);
            break;
        }
        }

        /* Operator registers */
    }
    else if((type >= 0x20 && type <= 0x80) || type == 0xE0)
    {
        /* Convert to operator number */
        op_num = op_lookup[reg_num & 0x1F];

        /* Valid register? */
        if(op_num < 0)
            return;

        /* Is it the other bank of operators? */
        if(reg_num & 0x100)
            op_num += 18;

        op = &self->Op[op_num];

        /* Do specific registers */
        switch(type)
        {

        /* Tremolo Enable / Vibrato Enable / Sustain Mode / Envelope Scaling / Frequency Multiplier */
        case 0x20:
        {
            OpalOperator_SetTremoloEnable(op, (val & 0x80) != 0);
            OpalOperator_SetVibratoEnable(op, (val & 0x40) != 0);
            OpalOperator_SetSustainMode(op, (val & 0x20) != 0);
            OpalOperator_SetEnvelopeScaling(op, (val & 0x10) != 0);
            OpalOperator_SetFrequencyMultiplier(op, val & 15);
            break;
        }

        /* Key Scale / Output Level */
        case 0x40:
        {
            OpalOperator_SetKeyScale(op, val >> 6);
            OpalOperator_SetOutputLevel(op, val & 0x3F);
            break;
        }

        /* Attack Rate / Decay Rate */
        case 0x60:
        {
            OpalOperator_SetAttackRate(op, val >> 4);
            OpalOperator_SetDecayRate(op, val & 15);
            break;
        }

        /* Sustain Level / Release Rate */
        case 0x80:
        {
            OpalOperator_SetSustainLevel(op, val >> 4);
            OpalOperator_SetReleaseRate(op, val & 15);
            break;
        }

        /* Waveform */
        case 0xE0:
        {
            OpalOperator_SetWaveform(op, val & 7);
            break;
        }
        }
    }
}